

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_postfix_fn_call(Parser *psr,Node *operand)

{
  BcIns ins;
  Function *fn;
  Node NVar1;
  BcIns call;
  uint8_t arg_count;
  Node arg;
  int num_args;
  uint8_t first_arg;
  Node *operand_local;
  Parser *psr_local;
  
  if (operand->type == NODE_LOCAL) {
    lex_next(&psr->lxr);
    arg.field_1.jmp.false_list._3_1_ = (undefined1)psr->scope->next_slot;
    arg.field_1.prim = PRIM_NIL;
    while ((psr->lxr).tk.type != 0x29) {
      NVar1 = parse_subexpr(psr,PREC_NONE);
      arg._0_8_ = NVar1.field_1;
      call = NVar1.type;
      expr_to_next_slot(psr,(Node *)&call);
      arg.field_1.prim = arg.field_1.prim + 1;
      if ((psr->lxr).tk.type == 0x2c) {
        lex_next(&psr->lxr);
      }
    }
    lex_next(&psr->lxr);
    ins = bc_new3(BC_CALL,(operand->field_1).slot,arg.field_1.jmp.false_list._3_1_,
                  (char)psr->scope->next_slot - arg.field_1._7_1_);
    fn = psr_fn(psr);
    fn_emit(fn,ins);
    operand->type = NODE_NON_RELOC;
    (operand->field_1).slot = arg.field_1.jmp.false_list._3_1_;
    psr->scope->next_slot = (byte)arg.field_1.jmp.false_list._3_1_ + 1;
    return;
  }
  psr_trigger_err(psr,"cannot call non-local type");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x43b,"void expr_postfix_fn_call(Parser *, Node *)");
}

Assistant:

static void expr_postfix_fn_call(Parser *psr, Node *operand) {
	// Check we have a valid operand type
	if (operand->type != NODE_LOCAL) {
		psr_trigger_err(psr, "cannot call non-local type");
		UNREACHABLE();
	}

	// Skip the opening parenthesis
	lex_next(&psr->lxr);

	// Keep track of where the first argument was placed on the stack
	uint8_t first_arg = (uint8_t) psr->scope->next_slot;

	// Keep parsing function call arguments separated by commas
	int num_args = 0;
	while (true) {
		// Stop parsing arguments if we've reached the final parenthesis
		if (psr->lxr.tk.type == ')') {
			lex_next(&psr->lxr);
			break;
		}

		// Parse the function call argument and put it into the next available
		// slot
		Node arg = parse_subexpr(psr, PREC_NONE);
		expr_to_next_slot(psr, &arg);
		num_args++;

		// Skip the comma if there is one
		if (psr->lxr.tk.type == ',') {
			lex_next(&psr->lxr);
		}
	}

	// Emit a function call instruction
	uint8_t arg_count = (uint8_t) psr->scope->next_slot - first_arg;
	BcIns call = bc_new3(BC_CALL, operand->slot, first_arg, arg_count);
	fn_emit(psr_fn(psr), call);

	// The return value is in the first argument slot
	operand->type = NODE_NON_RELOC;
	operand->slot = first_arg;

	// Remove all the function call arguments that we just put on the stack
	// now that the call is over, except the fist one which now holds the return
	// value
	psr->scope->next_slot = first_arg + 1;
}